

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

void hash_table_free(hash_table_t *h)

{
  hash_entry_s *phVar1;
  hash_entry_s *ptr;
  long lVar2;
  
  if (h != (hash_table_t *)0x0) {
    for (lVar2 = 0; lVar2 < h->size; lVar2 = lVar2 + 1) {
      ptr = h->table[lVar2].next;
      while (ptr != (hash_entry_s *)0x0) {
        phVar1 = ptr->next;
        ckd_free(ptr);
        ptr = phVar1;
      }
    }
    ckd_free(h->table);
    ckd_free(h);
    return;
  }
  return;
}

Assistant:

void
hash_table_free(hash_table_t * h)
{
    hash_entry_t *e, *e2;
    int32 i;

    if (h == NULL)
        return;

    /* Free additional entries created for key collision cases */
    for (i = 0; i < h->size; i++) {
        for (e = h->table[i].next; e; e = e2) {
            e2 = e->next;
            ckd_free((void *) e);
        }
    }

    ckd_free((void *) h->table);
    ckd_free((void *) h);
}